

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-server.c
# Opt level: O3

lws_fop_fd_t
test_server_fops_open(lws_plat_file_ops *fops,char *vfs_path,char *vpath,lws_fop_flags_t *flags)

{
  lws_fop_fd_t fop_fd;
  lws_filepos_t lVar1;
  
  fop_fd = (*fops_plat.open)(fops,vfs_path,vpath,flags);
  if (fop_fd == (lws_fop_fd_t)0x0) {
    _lws_log(8,"%s: open %s failed\n","test_server_fops_open",vfs_path);
  }
  else {
    lVar1 = lws_vfs_get_length(fop_fd);
    _lws_log(8,"%s: opening %s, ret %p, len %lu\n","test_server_fops_open",vfs_path,fop_fd,lVar1);
  }
  return fop_fd;
}

Assistant:

static lws_fop_fd_t
test_server_fops_open(const struct lws_plat_file_ops *fops,
		     const char *vfs_path, const char *vpath,
		     lws_fop_flags_t *flags)
{
	lws_fop_fd_t fop_fd;

	/* call through to original platform implementation */
	fop_fd = fops_plat.open(fops, vfs_path, vpath, flags);

	if (fop_fd)
		lwsl_info("%s: opening %s, ret %p, len %lu\n", __func__,
				vfs_path, fop_fd,
				(long)lws_vfs_get_length(fop_fd));
	else
		lwsl_info("%s: open %s failed\n", __func__, vfs_path);

	return fop_fd;
}